

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeAdapter.cpp
# Opt level: O0

void __thiscall
OpenMD::FluctuatingChargeAdapter::makeFluctuatingCharge
          (FluctuatingChargeAdapter *this,RealType chargeMass,RealType electronegativity,
          RealType hardness,int slaterN,RealType slaterZeta)

{
  bool bVar1;
  undefined4 in_ESI;
  Polynomial<double> *in_RDI;
  shared_ptr<OpenMD::GenericData> *in_XMM2_Qa;
  FluctuatingAtypeParameters fqParam;
  string *in_stack_ffffffffffffff08;
  AtomType *in_stack_ffffffffffffff10;
  shared_ptr<OpenMD::GenericData> *this_00;
  int exponent;
  FluctuatingAtypeParameters *in_stack_ffffffffffffff30;
  element_type *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff94;
  undefined1 local_60 [60];
  undefined4 local_24;
  shared_ptr<OpenMD::GenericData> *local_20;
  
  local_24 = in_ESI;
  local_20 = in_XMM2_Qa;
  bVar1 = isFluctuatingCharge((FluctuatingChargeAdapter *)0x269d4c);
  if (bVar1) {
    AtomType::removeProperty(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  exponent = (int)((ulong)local_60 >> 0x20);
  Polynomial<double>::Polynomial((Polynomial<double> *)0x269dc9);
  Polynomial<double>::setCoefficient(in_RDI,exponent,(double *)in_stack_ffffffffffffff10);
  Polynomial<double>::setCoefficient(in_RDI,exponent,(double *)in_stack_ffffffffffffff10);
  this_00 = *(shared_ptr<OpenMD::GenericData> **)&(in_RDI->polyPairMap_)._M_t._M_impl;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>,std::__cxx11::string_const&,OpenMD::FluctuatingAtypeParameters&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::shared_ptr<OpenMD::GenericData>::
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>,void>
            (this_00,(shared_ptr<OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>_> *)
                     &stack0xffffffffffffff38);
  AtomType::addProperty((AtomType *)CONCAT44(in_stack_ffffffffffffff94,local_24),local_20);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x269ebd);
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>_> *)0x269ec7);
  FluctuatingAtypeParameters::~FluctuatingAtypeParameters((FluctuatingAtypeParameters *)0x269ed1);
  return;
}

Assistant:

void FluctuatingChargeAdapter::makeFluctuatingCharge(
      RealType chargeMass, RealType electronegativity, RealType hardness,
      int slaterN, RealType slaterZeta) {
    if (isFluctuatingCharge()) { at_->removeProperty(FQtypeID); }

    FluctuatingAtypeParameters fqParam {};
    fqParam.chargeMass               = chargeMass;
    fqParam.usesSlaterIntramolecular = true;

    fqParam.electronegativity = electronegativity;
    fqParam.hardness          = hardness;
    fqParam.slaterN           = slaterN;
    fqParam.slaterZeta        = slaterZeta;

    fqParam.vself.setCoefficient(1, electronegativity);
    fqParam.vself.setCoefficient(2, 0.5 * hardness);

    at_->addProperty(std::make_shared<FluctuatingAtypeData>(FQtypeID, fqParam));
  }